

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O2

Datatype * __thiscall TypeOpIntSright::getInputLocal(TypeOpIntSright *this,PcodeOp *op,int4 slot)

{
  Datatype *pDVar1;
  
  if (slot == 1) {
    pDVar1 = TypeFactory::getBaseNoChar
                       ((this->super_TypeOpBinary).super_TypeOp.tlst,
                        (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                        _M_impl.super__Vector_impl_data._M_start[1]->size,TYPE_INT);
    return pDVar1;
  }
  pDVar1 = TypeOpBinary::getInputLocal(&this->super_TypeOpBinary,op,slot);
  return pDVar1;
}

Assistant:

Datatype *TypeOpIntSright::getInputLocal(const PcodeOp *op,int4 slot) const

{
  if (slot==1)
    return tlst->getBaseNoChar(op->getIn(1)->getSize(),TYPE_INT);
  return TypeOpBinary::getInputLocal(op,slot);
}